

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookahead.cpp
# Opt level: O2

void __thiscall Clasp::Lookahead::undoLevel(Lookahead *this,Solver *s)

{
  size_type sVar1;
  uint uVar2;
  pointer pLVar3;
  iterator pLVar4;
  pointer puVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  __off64_t *__offin;
  ulong uVar9;
  iterator first;
  __off64_t *in_R8;
  long lVar10;
  size_t in_R9;
  uint in_stack_ffffffffffffffd8;
  uint local_1c;
  
  sVar1 = (s->levels_).super_type.ebo_.size;
  if (sVar1 == (this->saved_).ebo_.size) {
    PostPropagator::cancelPropagation(&this->super_PostPropagator);
    pLVar3 = (s->assign_).trail.ebo_.buf;
    ScoreLook::scoreLits
              (&this->score,s,
               (Literal *)
               ((long)&pLVar3->rep_ +
               (ulong)(uint)(*(int *)((s->levels_).super_type.ebo_.buf +
                                     ((s->levels_).super_type.ebo_.size - 1)) << 2)),
               pLVar3 + (s->assign_).trail.ebo_.size);
    uVar2 = (s->levels_).super_type.ebo_.size;
    if (uVar2 == ((((this->nodes_).ebo_.buf)->lit).rep_ & 1)) {
      pLVar3 = (s->assign_).trail.ebo_.buf;
      uVar7 = (ulong)(uint)(*(int *)((s->levels_).super_type.ebo_.buf + (uVar2 - 1)) << 2);
      uVar2 = *(uint *)((long)&pLVar3->rep_ + uVar7);
      if ((uVar2 & 1) != 0) {
        uVar9 = (ulong)(s->assign_).trail.ebo_.size * 4 - uVar7 >> 2;
        uVar8 = 0x800;
        if ((uint)uVar9 < 0x800) {
          uVar8 = uVar9 & 0xffffffff;
        }
        bk_lib::pod_vector<Clasp::Literal,std::allocator<Clasp::Literal>>::
        assign<Clasp::Literal_const*>
                  ((pod_vector<Clasp::Literal,std::allocator<Clasp::Literal>> *)&this->imps_,
                   (Literal *)((long)&pLVar3[1].rep_ + uVar7),
                   (Literal *)((long)&pLVar3[uVar8].rep_ + uVar7));
        return;
      }
      if (0xbfffffff < *(uint *)(&((this->score).score.ebo_.buf)->field_0x0 + (uVar2 & 0xfffffffc)))
      {
        pLVar4 = (this->imps_).ebo_.buf;
        uVar2 = (this->imps_).ebo_.size;
        puVar5 = (s->assign_).assign_.ebo_.buf;
        first = pLVar4;
        for (lVar10 = 0; (ulong)uVar2 << 2 != lVar10; lVar10 = lVar10 + 4) {
          uVar6 = *(uint *)((long)&pLVar4->rep_ + lVar10);
          if ((byte)(*(byte *)((long)puVar5 + (ulong)(uVar6 & 0xfffffffc)) & 3) ==
              (byte)(2U - ((uVar6 & 2) == 0))) {
            first->rep_ = uVar6;
            first = first + 1;
          }
        }
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::erase
                  (&this->imps_,first,pLVar4 + (this->imps_).ebo_.size);
        return;
      }
    }
  }
  else {
    local_1c = 0;
    bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&this->saved_,sVar1 + 1,&local_1c);
    uVar6 = (this->saved_).ebo_.size - 1;
    uVar2 = (this->saved_).ebo_.buf[uVar6];
    (this->saved_).ebo_.size = uVar6;
    splice(this,uVar2,__offin,uVar6,in_R8,in_R9,in_stack_ffffffffffffffd8);
    ScoreLook::clearDeps(&this->score);
  }
  return;
}

Assistant:

void Lookahead::undoLevel(Solver& s) {
	if (s.decisionLevel() == saved_.size()) {
		cancelPropagation();
		const LitVec& a = s.trail();
		score.scoreLits(s, &a[0]+s.levelStart(s.decisionLevel()), &a[0]+a.size());
		if (s.decisionLevel() == static_cast<uint32>(head()->lit.flagged())) {
			const Literal* b = &a[0]+s.levelStart(s.decisionLevel());
			if (b->flagged()) {
				// remember current DL for b
				uint32 dist = static_cast<uint32>(((&a[0]+a.size()) - b));
				imps_.assign(b+1, b + std::min(dist, uint32(2048)));
			}
			else if (score.score[b->var()].testedBoth()) {
				// all true lits in imps_ follow from both *b and ~*b
				// and are therefore implied
				LitVec::iterator j = imps_.begin();
				for (LitVec::iterator it = imps_.begin(), end = imps_.end(); it != end; ++it) {
					if (s.isTrue(*it)) { *j++ = *it; }
				}
				imps_.erase(j, imps_.end());
			}
		}
	}
	else {
		assert(saved_.size() >= s.decisionLevel()+1);
		saved_.resize(s.decisionLevel()+1);
		NodeId n = saved_.back();
		saved_.pop_back();
		splice(n);
		assert(node(last_)->next == head_id);
		score.clearDeps();
	}
}